

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O3

int testNumberOfNeighborsWithDefaultValueOutOfRange(void)

{
  uint32_t uVar1;
  ulong uVar2;
  TypeUnion this;
  bool bVar3;
  Int64Parameter *this_00;
  Int64Range *pIVar4;
  UniformWeighting *pUVar5;
  NearestNeighborsIndex *this_01;
  SquaredEuclideanDistance *pSVar6;
  SingleKdTreeIndex *pSVar7;
  ostream *poVar8;
  undefined8 *puVar9;
  Arena *pAVar10;
  Model m1;
  Result res;
  Model MStack_68;
  Result local_38;
  
  CoreML::Specification::Model::Model(&MStack_68,(Arena *)0x0,false);
  CoreML::KNNValidatorTests::generateInterface(&MStack_68);
  if (MStack_68._oneof_case_[0] != 0x194) {
    CoreML::Specification::Model::clear_Type(&MStack_68);
    MStack_68._oneof_case_[0] = 0x194;
    pAVar10 = (Arena *)(MStack_68.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_68.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar10 = *(Arena **)pAVar10;
    }
    MStack_68.Type_.knearestneighborsclassifier_ =
         google::protobuf::Arena::
         CreateMaybeMessage<CoreML::Specification::KNearestNeighborsClassifier>(pAVar10);
  }
  this = MStack_68.Type_;
  this_00 = (MStack_68.Type_.knearestneighborsclassifier_)->numberofneighbors_;
  if (this_00 == (Int64Parameter *)0x0) {
    uVar2 = ((MStack_68.Type_.pipelineclassifier_)->super_MessageLite)._internal_metadata_.ptr_;
    pAVar10 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar10 = *(Arena **)pAVar10;
    }
    this_00 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64Parameter>
                        (pAVar10);
    (this.knearestneighborsclassifier_)->numberofneighbors_ = this_00;
  }
  if (this_00->_oneof_case_[0] == 10) {
    ((this_00->AllowedValues_).range_)->minvalue_ = 1;
  }
  else {
    CoreML::Specification::Int64Parameter::clear_AllowedValues(this_00);
    this_00->_oneof_case_[0] = 10;
    uVar2 = (this_00->super_MessageLite)._internal_metadata_.ptr_;
    pAVar10 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar10 = *(Arena **)pAVar10;
    }
    pIVar4 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64Range>(pAVar10)
    ;
    (this_00->AllowedValues_).range_ = pIVar4;
    uVar1 = this_00->_oneof_case_[0];
    pIVar4->minvalue_ = 1;
    if (uVar1 != 10) {
      CoreML::Specification::Int64Parameter::clear_AllowedValues(this_00);
      this_00->_oneof_case_[0] = 10;
      uVar2 = (this_00->super_MessageLite)._internal_metadata_.ptr_;
      pAVar10 = (Arena *)(uVar2 & 0xfffffffffffffffc);
      if ((uVar2 & 1) != 0) {
        pAVar10 = *(Arena **)pAVar10;
      }
      pIVar4 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64Range>
                         (pAVar10);
      (this_00->AllowedValues_).range_ = pIVar4;
      goto LAB_00149f5f;
    }
  }
  pIVar4 = (this_00->AllowedValues_).range_;
LAB_00149f5f:
  pIVar4->maxvalue_ = 10;
  this_00->defaultvalue_ = 0xf;
  if (((this.supportvectorclassifier_)->rho_).total_size_ != 200) {
    CoreML::Specification::KNearestNeighborsClassifier::clear_WeightingScheme
              (this.knearestneighborsclassifier_);
    ((this.supportvectorclassifier_)->rho_).total_size_ = 200;
    uVar2 = ((this.pipelineclassifier_)->super_MessageLite)._internal_metadata_.ptr_;
    pAVar10 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar10 = *(Arena **)pAVar10;
    }
    pUVar5 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::UniformWeighting>
                       (pAVar10);
    ((WeightingSchemeUnion *)((DefaultClassLabelUnion *)&(this.pipeline_)->names_ + 1))->
    uniformweighting_ = pUVar5;
  }
  this_01 = (this.knearestneighborsclassifier_)->nearestneighborsindex_;
  if (this_01 == (NearestNeighborsIndex *)0x0) {
    uVar2 = ((this.pipelineclassifier_)->super_MessageLite)._internal_metadata_.ptr_;
    pAVar10 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar10 = *(Arena **)pAVar10;
    }
    this_01 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::NearestNeighborsIndex>(pAVar10);
    (this.knearestneighborsclassifier_)->nearestneighborsindex_ = this_01;
  }
  if (this_01->_oneof_case_[1] != 200) {
    CoreML::Specification::NearestNeighborsIndex::clear_DistanceFunction(this_01);
    this_01->_oneof_case_[1] = 200;
    uVar2 = (this_01->super_MessageLite)._internal_metadata_.ptr_;
    pAVar10 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar10 = *(Arena **)pAVar10;
    }
    pSVar6 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::SquaredEuclideanDistance>(pAVar10);
    (this_01->DistanceFunction_).squaredeuclideandistance_ = pSVar6;
  }
  if (this_01->_oneof_case_[0] == 0x6e) {
    pSVar7 = (this_01->IndexType_).singlekdtreeindex_;
  }
  else {
    CoreML::Specification::NearestNeighborsIndex::clear_IndexType(this_01);
    this_01->_oneof_case_[0] = 0x6e;
    uVar2 = (this_01->super_MessageLite)._internal_metadata_.ptr_;
    pAVar10 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar10 = *(Arena **)pAVar10;
    }
    pSVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::SingleKdTreeIndex>
                       (pAVar10);
    (this_01->IndexType_).singlekdtreeindex_ = pSVar7;
  }
  pSVar7->leafsize_ = 0x1e;
  if (((this.supportvectorclassifier_)->rho_).current_size_ != 0x6e) {
    CoreML::Specification::KNearestNeighborsClassifier::clear_DefaultClassLabel
              (this.knearestneighborsclassifier_);
    ((this.supportvectorclassifier_)->rho_).current_size_ = 0x6e;
    ((DefaultClassLabelUnion *)&(this.pipeline_)->names_)->defaultint64label_ =
         (int64_t)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  }
  uVar2 = ((this.pipelineclassifier_)->super_MessageLite)._internal_metadata_.ptr_;
  puVar9 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
  if ((uVar2 & 1) != 0) {
    puVar9 = (undefined8 *)*puVar9;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)&(this.pipeline_)->names_,"Default",puVar9);
  CoreML::validate<(MLModelType)404>(&local_38,&MStack_68);
  bVar3 = CoreML::Result::good(&local_38);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
               ,0x69);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1e3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.m_message._M_dataplus._M_p != &local_38.m_message.field_2) {
    operator_delete(local_38.m_message._M_dataplus._M_p,
                    local_38.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&MStack_68);
  return (uint)bVar3;
}

Assistant:

int testNumberOfNeighborsWithDefaultValueOutOfRange() {

    Specification::Model m1;

    KNNValidatorTests::generateInterface(m1);

    auto *knnClassifier = m1.mutable_knearestneighborsclassifier();
    auto *numberOfNeighbors = knnClassifier->mutable_numberofneighbors();
    numberOfNeighbors->mutable_range()->set_minvalue(1);
    numberOfNeighbors->mutable_range()->set_maxvalue(10);
    numberOfNeighbors->set_defaultvalue(15);

    knnClassifier->mutable_uniformweighting();

    auto *nnIndex = knnClassifier->mutable_nearestneighborsindex();
    nnIndex->mutable_squaredeuclideandistance();
    auto *kdTree = nnIndex->mutable_singlekdtreeindex();
    kdTree->set_leafsize(30);
    knnClassifier->set_defaultstringlabel("Default");

    // Validation should fail since numberOfNeighbors defaultValue is out of range bounds.
    Result res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    return 0;

}